

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.hpp
# Opt level: O0

int boost::unit_test::ut_detail::case_ins<const_char>::compare(char *s1,char *s2,size_t n)

{
  bool bVar1;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  size_t i;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    if (CONCAT71(in_register_00000011,in_DL) <= local_28) {
      return 0;
    }
    bVar1 = eq('\0','\0');
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  bVar1 = lt('\0','\0');
  if (!bVar1) {
    return 1;
  }
  return -1;
}

Assistant:

static int          compare( CharT const* s1, CharT const* s2, std::size_t n )
    {
        for( std::size_t i = 0; i < n; ++i ) {
            if( !eq( s1[i], s2[i] ) )
                return lt( s1[i], s2[i] ) ? -1 : 1;
        }
        return 0;
    }